

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thingdef_parse.cpp
# Opt level: O2

void HandleActorFlag(FScanner *sc,Baggage *bag,char *part1,char *part2,int mod)

{
  AActor *defaults;
  FFlagDef *fd;
  
  fd = FindFlag(&bag->Info->super_PClass,part1,part2,false);
  if (fd == (FFlagDef *)0x0) {
    if (part2 == (char *)0x0) {
      FScanner::ScriptMessage(sc,"\"%s\" is an unknown flag\n",part1);
    }
    else {
      FScanner::ScriptMessage(sc,"\"%s.%s\" is an unknown flag\n",part1,part2);
    }
    FScriptPosition::ErrorCounter = FScriptPosition::ErrorCounter + 1;
    return;
  }
  defaults = (AActor *)(bag->Info->super_PClass).Defaults;
  if (fd->structoffset != -1) {
    ModActorFlag(defaults,fd,mod == 0x2b);
    return;
  }
  HandleDeprecatedFlags(defaults,bag->Info,mod == 0x2b,fd->flagbit);
  return;
}

Assistant:

void HandleActorFlag(FScanner &sc, Baggage &bag, const char *part1, const char *part2, int mod)
{
	FFlagDef *fd;

	if ( (fd = FindFlag (bag.Info, part1, part2)) )
	{
		AActor *defaults = (AActor*)bag.Info->Defaults;
		if (fd->structoffset == -1)	// this is a deprecated flag that has been changed into a real property
		{
			HandleDeprecatedFlags(defaults, bag.Info, mod=='+', fd->flagbit);
		}
		else
		{
			ModActorFlag(defaults, fd, mod == '+');
		}
	}
	else
	{
		if (part2 == NULL)
		{
			sc.ScriptMessage("\"%s\" is an unknown flag\n", part1);
		}
		else
		{
			sc.ScriptMessage("\"%s.%s\" is an unknown flag\n", part1, part2);
		}
		FScriptPosition::ErrorCounter++;
	}
}